

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 iPatternMatch(void *pText,sxu32 nLen,void *pPattern,sxu32 iPatLen,sxu32 *pOfft)

{
  char cVar1;
  char cVar2;
  __int32_t *p_Var3;
  __int32_t **pp_Var4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  if (nLen != 0 && iPatLen <= nLen) {
    pp_Var4 = __ctype_tolower_loc();
    p_Var3 = *pp_Var4;
    pcVar6 = (char *)((long)pText + 1);
    pcVar5 = (char *)pText;
    do {
      pcVar7 = pcVar6;
      pcVar8 = (char *)((long)pPattern + 1);
      if (p_Var3[*pcVar5] == p_Var3[*pPattern]) {
        do {
          if ((char *)((ulong)iPatLen + (long)pPattern) <= pcVar8) {
            if (pOfft == (sxu32 *)0x0) {
              return 0;
            }
            *pOfft = (int)pcVar5 - (int)pText;
            return 0;
          }
          if ((char *)((ulong)nLen + (long)pText) <= pcVar7) break;
          cVar1 = *pcVar7;
          cVar2 = *pcVar8;
          pcVar7 = pcVar7 + 1;
          pcVar8 = pcVar8 + 1;
        } while (p_Var3[cVar1] == p_Var3[cVar2]);
      }
      pcVar5 = pcVar5 + 1;
      pcVar6 = pcVar6 + 1;
    } while (pcVar5 < (char *)((ulong)nLen + (long)pText));
  }
  return -6;
}

Assistant:

static sxi32 iPatternMatch(const void *pText, sxu32 nLen, const void *pPattern, sxu32 iPatLen, sxu32 *pOfft)
{
	const char *zpIn = (const char *)pPattern;
	const char *zIn = (const char *)pText;
	const char *zpEnd = &zpIn[iPatLen];
	const char *zEnd = &zIn[nLen];
	const char *zPtr, *zPtr2;
	int c, d;
	if( iPatLen > nLen ){
		/* Don't bother processing */
		return SXERR_NOTFOUND;
	}
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		c = SyToLower(zIn[0]);
		d = SyToLower(zpIn[0]);
		if( c == d ){
			zPtr   = &zIn[1];
			zPtr2  = &zpIn[1];
			for(;;){
				if( zPtr2 >= zpEnd ){
					/* Pattern found */
					if( pOfft ){ *pOfft = (sxu32)(zIn-(const char *)pText); }
					return SXRET_OK;
				}
				if( zPtr >= zEnd ){
					break;
				}
				c = SyToLower(zPtr[0]);
				d = SyToLower(zPtr2[0]);
				if( c != d ){
					break;
				}
				zPtr++; zPtr2++;
			}
		}
		zIn++;
	}
	/* Pattern not found */
	return SXERR_NOTFOUND;
}